

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_6::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  char *pcVar1;
  Iterator *local_20;
  
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    IteratorWrapper::status((IteratorWrapper *)&local_20);
    if ((this->status_).state_ == (char *)0x0) {
      if (local_20 == (Iterator *)0x0) goto LAB_0011cffa;
      pcVar1 = Status::CopyState((char *)local_20);
      (this->status_).state_ = pcVar1;
    }
    if (local_20 != (Iterator *)0x0) {
      operator_delete__(local_20);
    }
  }
LAB_0011cffa:
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  return;
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}